

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.cpp
# Opt level: O0

void __thiscall Perseus::PlanLeadOut(Perseus *this)

{
  int iVar1;
  PlanningUnitDecPOMDPDiscrete *pPVar2;
  ostream *poVar3;
  size_t sVar4;
  Perseus *in_RDI;
  stringstream ss;
  Perseus *in_stack_fffffffffffffd18;
  TimedAlgorithm *in_stack_fffffffffffffd20;
  allocator<char> *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  PlanningUnit *in_stack_fffffffffffffd60;
  string local_268 [32];
  string local_248 [32];
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [32];
  string local_1e0 [32];
  stringstream local_1c0 [16];
  ostream local_1b0 [392];
  string local_28 [40];
  
  GetIdentification_abi_cxx11_(in_stack_fffffffffffffd18);
  TimedAlgorithm::StopTimer(in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_28);
  if ((in_RDI->_m_storeTimings & 1U) != 0) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    pPVar2 = AlphaVectorPlanning::GetPU((AlphaVectorPlanning *)in_stack_fffffffffffffd18);
    directories::MADPGetResultsDir((string *)pPVar2,in_stack_fffffffffffffd60);
    poVar3 = std::operator<<(local_1b0,local_1e0);
    poVar3 = std::operator<<(poVar3,"/");
    GetIdentification_abi_cxx11_(in_stack_fffffffffffffd18);
    poVar3 = std::operator<<(poVar3,local_228);
    poVar3 = std::operator<<(poVar3,"Timings_h");
    pPVar2 = AlphaVectorPlanning::GetPU((AlphaVectorPlanning *)in_stack_fffffffffffffd18);
    sVar4 = PlanningUnit::GetHorizon((PlanningUnit *)pPVar2);
    std::ostream::operator<<(poVar3,sVar4);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::stringstream::str();
    TimedAlgorithm::SaveTimers(in_stack_fffffffffffffd20,(string *)in_stack_fffffffffffffd18);
    std::__cxx11::string::~string(local_248);
    iVar1 = GetVerbose(in_RDI);
    if (0 < iVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Saved timing results to ");
      std::__cxx11::stringstream::str();
      poVar3 = std::operator<<(poVar3,local_268);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_268);
    }
    std::__cxx11::stringstream::~stringstream(local_1c0);
  }
  return;
}

Assistant:

void Perseus::PlanLeadOut()
{
    StopTimer(GetIdentification());
    if(_m_storeTimings)
    {
        stringstream ss;
        ss << directories::MADPGetResultsDir("POMDP",GetPU()) << "/"
           << GetIdentification() << "Timings_h" << GetPU()->GetHorizon();
        SaveTimers(ss.str());
        if(GetVerbose() >= 1)
            cout << "Saved timing results to " << ss.str() << endl;
    }
}